

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O1

void Omega_h::ghost_mesh(Mesh *mesh,Int nlayers,bool verbose)

{
  int *piVar1;
  void **ppvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Alloc *pAVar4;
  void *pvVar5;
  void *pvVar6;
  Int IVar7;
  uint uVar8;
  LO nrroots;
  undefined8 uVar9;
  char *pcVar10;
  int iVar11;
  Remotes vert_use_owners;
  RemoteGraph own_verts2own_elems;
  Read<long> old_owner_globals;
  Remotes new_use_owners;
  Dist owners2elems;
  Dist verts2owners;
  Dist elems2owners;
  Dist uses2old_owners;
  Alloc *local_740;
  Alloc *local_730;
  GOs local_718;
  Remotes local_708;
  RemoteGraph local_6e0;
  Alloc *local_6b0;
  element_type *local_6a8;
  Remotes local_6a0;
  Remotes local_680;
  RemoteGraph local_660;
  Remotes local_630;
  RemoteGraph local_610;
  CommPtr local_5e0;
  Dist local_5d0;
  Dist local_540;
  Dist local_4b0;
  Dist local_420;
  Dist local_390;
  Dist local_300;
  Dist local_270;
  Dist local_1e0;
  Dist local_150;
  Dist local_c0;
  
  IVar7 = Mesh::nghost_layers(mesh);
  if (IVar7 < 0) {
    pcVar10 = "mesh->nghost_layers() >= 0";
    uVar9 = 0x67;
  }
  else {
    IVar7 = Mesh::nghost_layers(mesh);
    if (IVar7 < nlayers) {
      uVar8 = Mesh::nghost_layers(mesh);
      get_own_verts2own_elems(&local_6e0,mesh);
      Mesh::ask_dist(&local_540,mesh,0);
      local_660.locals2edges.write_.shared_alloc_.alloc =
           local_6e0.locals2edges.write_.shared_alloc_.alloc;
      if (((ulong)local_6e0.locals2edges.write_.shared_alloc_.alloc & 7) == 0 &&
          local_6e0.locals2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_660.locals2edges.write_.shared_alloc_.alloc =
               (Alloc *)((local_6e0.locals2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_6e0.locals2edges.write_.shared_alloc_.alloc)->use_count =
               (local_6e0.locals2edges.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_660.locals2edges.write_.shared_alloc_.direct_ptr =
           local_6e0.locals2edges.write_.shared_alloc_.direct_ptr;
      local_660.edges2remotes.ranks.write_.shared_alloc_.alloc =
           local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc;
      if (((ulong)local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
          local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_660.edges2remotes.ranks.write_.shared_alloc_.alloc =
               (Alloc *)((local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count =
               (local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_660.edges2remotes.ranks.write_.shared_alloc_.direct_ptr =
           local_6e0.edges2remotes.ranks.write_.shared_alloc_.direct_ptr;
      local_660.edges2remotes.idxs.write_.shared_alloc_.alloc =
           local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc;
      if (((ulong)local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
          local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_660.edges2remotes.idxs.write_.shared_alloc_.alloc =
               (Alloc *)((local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count =
               (local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_660.edges2remotes.idxs.write_.shared_alloc_.direct_ptr =
           local_6e0.edges2remotes.idxs.write_.shared_alloc_.direct_ptr;
      Dist::Dist(&local_300,&local_540);
      close_up(&local_4b0,mesh,&local_660,&local_300);
      Dist::~Dist(&local_300);
      RemoteGraph::~RemoteGraph(&local_660);
      local_708.idxs.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_708.idxs.write_.shared_alloc_.direct_ptr = (pointer)0x0;
      local_708.ranks.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_708.ranks.write_.shared_alloc_.direct_ptr = (pointer)0x0;
      if (1 < (int)(nlayers - uVar8)) {
        if (3 < (uint)mesh->dim_) {
          fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
               ,0x33);
        }
        form_down_use_owners((Remotes *)&local_5d0,mesh,mesh->dim_,0);
        Remotes::operator=(&local_708,(Remotes *)&local_5d0);
        if (((ulong)local_5d0.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
            local_5d0.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_5d0.roots2items_[0].write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_5d0.roots2items_[0].write_.shared_alloc_.alloc);
            operator_delete(local_5d0.roots2items_[0].write_.shared_alloc_.alloc,0x48);
          }
        }
        if (((ulong)local_5d0.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0
            && local_5d0.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr != (element_type *)0x0) {
          ppvVar2 = &((local_5d0.parent_comm_.
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     host_srcs_).read_.write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_5d0.parent_comm_.
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
            operator_delete(local_5d0.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            0x48);
          }
        }
      }
      if (1 < (int)(nlayers - uVar8)) {
        iVar11 = ~uVar8 + nlayers;
        do {
          pvVar6 = local_708.idxs.write_.shared_alloc_.direct_ptr;
          pvVar5 = local_708.ranks.write_.shared_alloc_.direct_ptr;
          local_740 = local_708.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_708.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_708.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_740 = (Alloc *)((local_708.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_708.ranks.write_.shared_alloc_.alloc)->use_count =
                   (local_708.ranks.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_730 = local_708.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_708.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_708.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_730 = (Alloc *)((local_708.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_708.idxs.write_.shared_alloc_.alloc)->use_count =
                   (local_708.idxs.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          Dist::Dist(&local_390,&local_4b0);
          uVar8 = mesh->dim_;
          if (3 < uVar8) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          Dist::invert(&local_5d0,&local_390);
          local_680.ranks.write_.shared_alloc_.alloc = local_740;
          if (((ulong)local_740 & 7) == 0 && local_740 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_680.ranks.write_.shared_alloc_.alloc = (Alloc *)(local_740->size * 8 + 1);
            }
            else {
              local_740->use_count = local_740->use_count + 1;
            }
          }
          local_680.ranks.write_.shared_alloc_.direct_ptr = pvVar5;
          local_680.idxs.write_.shared_alloc_.alloc = local_730;
          if (((ulong)local_730 & 7) == 0 && local_730 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_680.idxs.write_.shared_alloc_.alloc = (Alloc *)(local_730->size * 8 + 1);
            }
            else {
              local_730->use_count = local_730->use_count + 1;
            }
          }
          local_680.idxs.write_.shared_alloc_.direct_ptr = pvVar6;
          Dist::exch(&local_630,&local_5d0,&local_680,uVar8 + 1);
          pAVar4 = local_680.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_680.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_680.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_680.idxs.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_680.idxs.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          pAVar4 = local_680.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_680.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_680.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_680.ranks.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_680.ranks.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          Mesh::comm(mesh);
          local_6a0.ranks.write_.shared_alloc_.alloc = local_630.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_630.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_630.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_6a0.ranks.write_.shared_alloc_.alloc =
                   (Alloc *)((local_630.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_630.ranks.write_.shared_alloc_.alloc)->use_count =
                   (local_630.ranks.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_6a0.ranks.write_.shared_alloc_.direct_ptr =
               local_630.ranks.write_.shared_alloc_.direct_ptr;
          local_6a0.idxs.write_.shared_alloc_.alloc = local_630.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_630.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_630.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_6a0.idxs.write_.shared_alloc_.alloc =
                   (Alloc *)((local_630.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_630.idxs.write_.shared_alloc_.alloc)->use_count =
                   (local_630.idxs.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_6a0.idxs.write_.shared_alloc_.direct_ptr =
               local_630.idxs.write_.shared_alloc_.direct_ptr;
          nrroots = Mesh::nents(mesh,0);
          Dist::Dist(&local_1e0,&local_5e0,&local_6a0,nrroots);
          pAVar4 = local_6a0.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_6a0.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6a0.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_6a0.idxs.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_6a0.idxs.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          pAVar4 = local_6a0.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_6a0.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6a0.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_6a0.ranks.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_6a0.ranks.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          if (local_5e0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_5e0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          Mesh::globals((Mesh *)&local_6b0,(Int)mesh);
          Dist::Dist(&local_270,&local_1e0);
          local_718.write_.shared_alloc_.alloc = local_6b0;
          if (((ulong)local_6b0 & 7) == 0 && local_6b0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_718.write_.shared_alloc_.alloc = (Alloc *)(local_6b0->size * 8 + 1);
            }
            else {
              local_6b0->use_count = local_6b0->use_count + 1;
            }
          }
          local_718.write_.shared_alloc_.direct_ptr = local_6a8;
          get_new_copies2old_owners(&local_150,&local_270,&local_718);
          pAVar4 = local_718.write_.shared_alloc_.alloc;
          if (((ulong)local_718.write_.shared_alloc_.alloc & 7) == 0 &&
              local_718.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_718.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_718.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          Dist::~Dist(&local_270);
          pAVar4 = local_6b0;
          if (((ulong)local_6b0 & 7) == 0 && local_6b0 != (Alloc *)0x0) {
            piVar1 = &local_6b0->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_6b0);
              operator_delete(pAVar4,0x48);
            }
          }
          Dist::~Dist(&local_1e0);
          pAVar4 = local_630.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_630.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_630.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_630.idxs.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_630.idxs.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          pAVar4 = local_630.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_630.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_630.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_630.ranks.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_630.ranks.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          Dist::~Dist(&local_5d0);
          Dist::operator=(&local_540,&local_150);
          Dist::~Dist(&local_150);
          Dist::~Dist(&local_390);
          if (((ulong)local_730 & 7) == 0 && local_730 != (Alloc *)0x0) {
            piVar1 = &local_730->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_730);
              operator_delete(local_730,0x48);
            }
          }
          if (((ulong)local_740 & 7) == 0 && local_740 != (Alloc *)0x0) {
            piVar1 = &local_740->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_740);
              operator_delete(local_740,0x48);
            }
          }
          local_610.locals2edges.write_.shared_alloc_.alloc =
               local_6e0.locals2edges.write_.shared_alloc_.alloc;
          if (((ulong)local_6e0.locals2edges.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6e0.locals2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_610.locals2edges.write_.shared_alloc_.alloc =
                   (Alloc *)((local_6e0.locals2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_6e0.locals2edges.write_.shared_alloc_.alloc)->use_count =
                   (local_6e0.locals2edges.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_610.locals2edges.write_.shared_alloc_.direct_ptr =
               local_6e0.locals2edges.write_.shared_alloc_.direct_ptr;
          local_610.edges2remotes.ranks.write_.shared_alloc_.alloc =
               local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_610.edges2remotes.ranks.write_.shared_alloc_.alloc =
                   (Alloc *)((local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count =
                   (local_6e0.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_610.edges2remotes.ranks.write_.shared_alloc_.direct_ptr =
               local_6e0.edges2remotes.ranks.write_.shared_alloc_.direct_ptr;
          local_610.edges2remotes.idxs.write_.shared_alloc_.alloc =
               local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_610.edges2remotes.idxs.write_.shared_alloc_.alloc =
                   (Alloc *)((local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc)->size * 8 + 1
                            );
            }
            else {
              (local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count =
                   (local_6e0.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_610.edges2remotes.idxs.write_.shared_alloc_.direct_ptr =
               local_6e0.edges2remotes.idxs.write_.shared_alloc_.direct_ptr;
          Dist::Dist(&local_c0,&local_540);
          close_up(&local_5d0,mesh,&local_610,&local_c0);
          Dist::operator=(&local_4b0,&local_5d0);
          Dist::~Dist(&local_5d0);
          Dist::~Dist(&local_c0);
          RemoteGraph::~RemoteGraph(&local_610);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      Dist::Dist(&local_420,&local_4b0);
      migrate_mesh(mesh,&local_420,OMEGA_H_GHOSTED,verbose);
      Dist::~Dist(&local_420);
      pAVar4 = local_708.idxs.write_.shared_alloc_.alloc;
      if (((ulong)local_708.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
          local_708.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_708.idxs.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_708.idxs.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      pAVar4 = local_708.ranks.write_.shared_alloc_.alloc;
      if (((ulong)local_708.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
          local_708.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_708.ranks.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_708.ranks.write_.shared_alloc_.alloc);
          operator_delete(pAVar4,0x48);
        }
      }
      Dist::~Dist(&local_4b0);
      Dist::~Dist(&local_540);
      RemoteGraph::~RemoteGraph(&local_6e0);
      return;
    }
    pcVar10 = "nlayers > mesh->nghost_layers()";
    uVar9 = 0x68;
  }
  fail("assertion %s failed at %s +%d\n",pcVar10,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
       ,uVar9);
}

Assistant:

void ghost_mesh(Mesh* mesh, Int nlayers, bool verbose) {
  OMEGA_H_CHECK(mesh->nghost_layers() >= 0);
  OMEGA_H_CHECK(nlayers > mesh->nghost_layers());
  auto nnew_layers = nlayers - mesh->nghost_layers();
  auto own_verts2own_elems = get_own_verts2own_elems(mesh);
  auto verts2owners = mesh->ask_dist(VERT);
  auto elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  auto vert_use_owners = Remotes();
  if (nnew_layers > 1) {
    vert_use_owners = form_down_use_owners(mesh, mesh->dim(), VERT);
  }
  for (Int i = 1; i < nnew_layers; ++i) {
    verts2owners = close_down(mesh, vert_use_owners, elems2owners);
    elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  }
  migrate_mesh(mesh, elems2owners, OMEGA_H_GHOSTED, verbose);
}